

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Thing_SetConversation
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  AActor *pAVar2;
  FStrifeDialogueNode *pFVar3;
  FActorIterator iterator;
  
  if (arg1 == 0) {
    iVar1 = -1;
    pFVar3 = (FStrifeDialogueNode *)0x0;
  }
  else {
    iVar1 = GetConversation(arg1);
    if (iVar1 == -1) {
      return 0;
    }
    pFVar3 = StrifeDialogues.Array[iVar1];
  }
  if (arg0 == 0) {
    if (it != (AActor *)0x0) {
      it->ConversationRoot = iVar1;
      it->Conversation = pFVar3;
    }
  }
  else {
    iterator.base = (AActor *)0x0;
    iterator.id = arg0;
    while (pAVar2 = FActorIterator::Next(&iterator), pAVar2 != (AActor *)0x0) {
      pAVar2->ConversationRoot = iVar1;
      pAVar2->Conversation = pFVar3;
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_SetConversation)
// Thing_SetConversation (tid, dlg_id)
{
	int dlg_index = -1;
	FStrifeDialogueNode *node = NULL;

	if (arg1 != 0)
	{
		dlg_index = GetConversation(arg1);	
		if (dlg_index == -1) return false;
		node = StrifeDialogues[dlg_index];
	}

	if (arg0 != 0)
	{
		FActorIterator iterator (arg0);
		while ((it = iterator.Next()) != NULL)
		{
			it->ConversationRoot = dlg_index;
			it->Conversation = node;
		}
	}
	else if (it)
	{
		it->ConversationRoot = dlg_index;
		it->Conversation = node;
	}
	return true;
}